

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

int GCPtr<symbols::FunctionObject>::shutdown(int __fd,int __how)

{
  bool bVar1;
  int iVar2;
  pointer pGVar3;
  undefined7 extraout_var;
  _Self local_20;
  _List_node_base *local_18;
  _List_iterator<GCInfo<symbols::FunctionObject>_> local_10;
  iterator p;
  
  iVar2 = gclistSize();
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    std::_List_iterator<GCInfo<symbols::FunctionObject>_>::_List_iterator(&local_10);
    local_18 = (_List_node_base *)
               std::__cxx11::
               list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>
               ::begin(&gclist_abi_cxx11_);
    local_10._M_node = local_18;
    while( true ) {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>
           ::end(&gclist_abi_cxx11_);
      bVar1 = std::operator==(&local_10,&local_20);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pGVar3 = std::_List_iterator<GCInfo<symbols::FunctionObject>_>::operator->(&local_10);
      pGVar3->refcount = 0;
      std::_List_iterator<GCInfo<symbols::FunctionObject>_>::operator++(&local_10,0);
    }
    bVar1 = collect();
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  return iVar2;
}

Assistant:

void GCPtr<T>::shutdown() {
    if(gclistSize() == 0) return ; // list is empty

    typename list<GCInfo<T>>::iterator p;

    for(p = gclist.begin(); p != gclist.end(); p++){
        // Set all reference counts to zero
        p->refcount = 0;
    }
    #ifdef DISPLAY
    cout << "Before collecting for shutdown() for "
    << typeid(T).name() << "\n";
    #endif

    collect();

    #ifdef DISPLAY
    cout << "After collecting for shutdown() for "
    << typeid(T).name() << "\n";
    #endif


}